

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_geometry_device.cpp
# Opt level: O0

void embree::renderPixelStandard
               (TutorialData *data,int x,int y,int *pixels,uint width,uint height,float time,
               ISPCCamera *camera,RayStats *stats)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  float fVar6;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  undefined8 *in_stack_00000008;
  int *in_stack_00000010;
  uint b;
  uint g;
  uint r;
  float d;
  float s;
  Vec3fa r_4;
  RTCOccludedArguments sargs;
  Ray shadow;
  Vec3fa lightDir;
  Vec3fa Ng;
  Vec3fa diffuse;
  Vec3fa color;
  RTCIntersectArguments iargs;
  Ray ray;
  __m128 c_2;
  __m128 r_2;
  __m128 a_2;
  __m128 c_1;
  __m128 r_1;
  __m128 a_1;
  __m128 c_4;
  __m128 r_3;
  __m128 a_4;
  __m128 c_6;
  __m128 r_5;
  __m128 a_6;
  vint4 mask_4;
  vint4 mask_3;
  vint4 mask_1;
  vint4 mask;
  __m128 mask_2;
  vfloat4 c_7;
  vfloat4 b_4;
  vfloat4 a_7;
  vfloat4 c_8;
  vfloat4 b_5;
  vfloat4 a_8;
  vfloat4 c_5;
  vfloat4 b_3;
  vfloat4 a_5;
  vfloat4 c_3;
  vfloat4 b_2;
  vfloat4 a_3;
  vfloat4 c;
  vfloat4 b_1;
  vfloat4 a;
  float local_2b60;
  float local_2b5c;
  float local_2b58;
  float local_2b54;
  float local_2b50;
  float local_2b4c;
  float local_2b48;
  float local_2b44;
  float local_2b40;
  float local_2b3c;
  uint local_2b14;
  undefined8 local_2ac8;
  float fStack_2ac0;
  undefined4 local_2a68;
  undefined4 local_2a64;
  float local_2a60 [2];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2a58;
  embree local_2a48 [16];
  undefined8 local_2a38;
  undefined8 uStack_2a30;
  undefined4 local_2a28;
  undefined4 local_2a24;
  undefined8 local_2a20;
  undefined8 local_2a18;
  undefined8 local_2a10;
  undefined1 local_2a08 [8];
  ulong uStack_2a00;
  undefined8 local_29f8;
  undefined8 uStack_29f0;
  undefined8 local_29e8;
  ulong uStack_29e0;
  undefined8 local_29d8;
  ulong uStack_29d0;
  undefined8 local_29c8;
  ulong uStack_29c0;
  undefined1 local_29b8 [8];
  ulong uStack_29b0;
  float local_29a8;
  undefined4 local_29a4;
  undefined1 auStack_2998 [20];
  undefined4 local_2984;
  undefined4 local_2980;
  undefined4 local_297c;
  undefined4 local_2978;
  undefined8 local_2968;
  undefined8 uStack_2960;
  float local_2958;
  float fStack_2954;
  float fStack_2950;
  float fStack_294c;
  undefined8 local_2948;
  undefined8 uStack_2940;
  float local_2938;
  float fStack_2934;
  ulong uStack_2930;
  float local_2924 [3];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2918;
  undefined8 local_2908;
  undefined8 uStack_2900;
  float local_28f8;
  float fStack_28f4;
  ulong uStack_28f0;
  undefined4 local_28e8;
  undefined4 local_28e4;
  undefined8 local_28e0;
  undefined8 local_28d8;
  undefined8 local_28d0;
  undefined8 local_28c8;
  ulong uStack_28c0;
  undefined8 local_28b8;
  ulong uStack_28b0;
  undefined8 local_28a8;
  undefined8 uStack_28a0;
  undefined8 local_2898;
  ulong uStack_2890;
  undefined8 local_2888;
  undefined8 uStack_2880;
  undefined8 local_2878;
  undefined8 uStack_2870;
  undefined8 local_2868;
  undefined8 uStack_2860;
  undefined8 local_2858;
  ulong uStack_2850;
  undefined8 local_2848;
  ulong uStack_2840;
  undefined8 local_2838;
  ulong uStack_2830;
  undefined8 local_2828;
  ulong uStack_2820;
  float local_2818;
  undefined4 local_2814;
  float local_2808;
  float local_2804;
  float local_2800;
  uint local_27f4;
  int local_27f0;
  undefined4 local_27ec;
  undefined4 local_27e8;
  int local_27c4;
  long local_27c0;
  int local_27b8;
  int local_27b4;
  long local_27b0;
  undefined4 local_27a4;
  undefined4 local_27a0;
  undefined4 local_279c;
  undefined8 *local_2798;
  float *local_2780;
  float *local_2778;
  embree *local_2770;
  undefined8 *local_2768;
  undefined8 *local_2760;
  float *local_2758;
  undefined8 *local_2750;
  undefined8 *local_2748;
  undefined8 *local_2740;
  undefined8 *local_2738;
  undefined8 *local_2728;
  undefined8 *local_2720;
  undefined8 *local_2718;
  undefined8 *local_2710;
  undefined8 *local_2708;
  float *local_2700;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_26f8;
  undefined8 *local_26c0;
  float *local_26b8;
  float *local_26b0;
  undefined8 *local_26a8;
  undefined8 *local_26a0;
  undefined8 *local_2698;
  undefined8 *local_2690;
  undefined8 *local_2688;
  undefined8 *local_2680;
  undefined8 local_2648;
  undefined8 uStack_2640;
  undefined8 *local_2630;
  float local_2624;
  undefined8 *local_2620;
  undefined8 local_2618;
  undefined8 uStack_2610;
  undefined8 *local_2600;
  float local_25f4;
  undefined8 *local_25f0;
  undefined1 *local_25e8;
  undefined1 *local_25e0;
  undefined4 local_25d8;
  undefined4 local_25d4;
  undefined4 local_25d0;
  undefined4 local_25cc;
  float local_25c8;
  undefined4 local_25c4;
  undefined8 *local_25c0;
  undefined8 *local_25b8;
  undefined8 *local_25b0;
  undefined4 local_25a8;
  undefined4 local_25a4;
  undefined4 local_25a0;
  undefined4 local_259c;
  float local_2598;
  undefined4 local_2594;
  undefined1 *local_2590;
  undefined8 *local_2588;
  undefined8 *local_2580;
  undefined4 *local_2578;
  undefined8 *local_2570;
  int *local_2568;
  float local_255c;
  undefined8 *local_2558;
  float local_254c;
  undefined8 *local_2548;
  undefined4 local_252c;
  float *local_2528;
  undefined8 *local_2510;
  undefined8 *local_2508;
  float local_24fc;
  float *local_24f8;
  float *local_24f0;
  undefined8 local_24e8;
  undefined8 uStack_24e0;
  float local_24cc;
  undefined8 *local_24c8;
  undefined8 *local_24c0;
  float local_24b4;
  undefined8 *local_24b0;
  undefined8 local_24a8;
  undefined8 uStack_24a0;
  float local_248c;
  undefined8 *local_2488;
  float *local_2480;
  float local_2474;
  undefined8 *local_2470;
  undefined8 local_2468;
  undefined8 uStack_2460;
  float local_244c;
  embree *local_2448;
  undefined8 *local_2440;
  float local_2434;
  undefined8 *local_2430;
  undefined8 local_23e8;
  undefined8 uStack_23e0;
  undefined4 local_23d4;
  undefined8 *local_23d0;
  undefined8 *local_23c8;
  undefined4 local_23bc;
  undefined8 *local_23b8;
  undefined8 *local_23b0;
  undefined8 *local_23a8;
  undefined8 *local_23a0;
  undefined1 local_2398 [16];
  undefined8 *local_2388;
  float local_237c;
  undefined8 *local_2378;
  undefined8 *local_2370;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_2368;
  undefined8 *local_2360;
  undefined8 *local_2358;
  float *local_2350;
  undefined1 *local_2348;
  undefined4 *local_2340;
  undefined8 *local_2338;
  int *local_2330;
  undefined4 local_2328;
  float local_2324;
  undefined4 *local_22c0;
  undefined4 *local_22b8;
  float *local_22b0;
  undefined8 local_22a8;
  undefined8 uStack_22a0;
  undefined8 *local_2298;
  undefined8 *local_2290;
  undefined8 local_2288;
  undefined8 uStack_2280;
  undefined8 *local_2278;
  undefined8 *local_2270;
  undefined8 local_2268;
  undefined8 uStack_2260;
  embree *local_2258;
  embree *local_2250;
  undefined8 local_2228;
  undefined8 uStack_2220;
  float *local_2218;
  undefined8 *local_2210;
  float local_2208;
  ulong uStack_2200;
  float local_21f8;
  undefined4 local_21ec;
  undefined8 local_21e8;
  ulong uStack_21e0;
  undefined4 local_21d8;
  undefined4 local_21d4;
  float local_21d0;
  undefined4 local_21cc;
  undefined8 local_21c8;
  ulong uStack_21c0;
  undefined4 local_21b8;
  undefined4 local_21b4;
  uint local_21b0;
  undefined4 local_21ac;
  undefined8 local_21a8;
  ulong uStack_21a0;
  undefined4 local_2198;
  undefined4 local_2194;
  uint local_2190;
  undefined4 local_218c;
  undefined8 local_2188;
  ulong uStack_2180;
  undefined4 local_2178;
  undefined4 local_2174;
  uint local_2170;
  undefined4 local_216c;
  undefined8 local_2168;
  undefined8 uStack_2160;
  undefined4 local_2158;
  undefined4 local_2154;
  undefined4 local_2150;
  undefined4 local_214c;
  ulong local_2148;
  undefined8 uStack_2140;
  undefined1 local_2138 [16];
  ulong local_2128;
  undefined8 uStack_2120;
  float local_210c;
  ulong local_2108;
  undefined8 uStack_2100;
  undefined1 local_20f8 [16];
  ulong local_20e8;
  undefined8 uStack_20e0;
  float local_20cc;
  ulong local_20c8;
  undefined8 uStack_20c0;
  undefined1 local_20b8 [16];
  undefined8 local_20a8;
  undefined8 uStack_20a0;
  undefined4 local_208c;
  ulong local_2088;
  undefined8 uStack_2080;
  undefined1 local_2078 [16];
  ulong local_2068;
  undefined8 uStack_2060;
  float local_204c;
  undefined1 local_2048 [16];
  undefined4 local_202c;
  undefined1 local_2028 [16];
  undefined4 local_200c;
  undefined1 local_2008 [16];
  float local_1fec;
  undefined1 local_1fe8 [16];
  undefined4 local_1fcc;
  undefined1 local_1fc8 [16];
  undefined4 local_1fac;
  undefined1 local_1fa8 [16];
  undefined4 local_1f8c;
  undefined1 local_1f88 [16];
  undefined4 local_1f6c;
  undefined1 local_1f68 [16];
  undefined4 local_1f4c;
  undefined1 local_1f48 [16];
  float local_1f2c;
  undefined1 local_1f28 [16];
  undefined4 local_1f0c;
  undefined1 local_1f08 [16];
  undefined4 local_1eec;
  undefined1 local_1ee8 [16];
  float local_1ecc;
  ulong local_1ec8;
  undefined8 uStack_1ec0;
  undefined8 local_1eb8;
  undefined8 uStack_1eb0;
  ulong local_1ea8;
  undefined8 uStack_1ea0;
  ulong local_1e98;
  undefined8 uStack_1e90;
  ulong local_1e88;
  undefined8 uStack_1e80;
  ulong local_1e78;
  undefined8 uStack_1e70;
  ulong local_1e68;
  undefined8 uStack_1e60;
  ulong local_1e58;
  undefined8 uStack_1e50;
  ulong local_1e48;
  undefined8 uStack_1e40;
  ulong local_1e38;
  undefined8 uStack_1e30;
  ulong local_1e28;
  undefined8 uStack_1e20;
  ulong local_1e18;
  undefined8 uStack_1e10;
  undefined8 local_1e08;
  undefined8 uStack_1e00;
  ulong local_1df8;
  undefined8 uStack_1df0;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  undefined8 local_1dd8;
  undefined8 uStack_1dd0;
  undefined8 local_1dc8;
  undefined8 uStack_1dc0;
  ulong local_1db8;
  undefined8 uStack_1db0;
  undefined8 local_1da8;
  undefined8 uStack_1da0;
  ulong local_1d98;
  undefined8 uStack_1d90;
  undefined8 local_1d88;
  undefined8 uStack_1d80;
  ulong local_1d78;
  undefined8 uStack_1d70;
  undefined8 local_1d68;
  undefined8 uStack_1d60;
  ulong local_1d58;
  undefined8 uStack_1d50;
  undefined8 local_1d48;
  undefined8 uStack_1d40;
  undefined8 local_1d38;
  undefined8 uStack_1d30;
  undefined8 local_1d28;
  undefined8 uStack_1d20;
  ulong local_1d18;
  undefined8 uStack_1d10;
  undefined8 local_1d08;
  undefined8 uStack_1d00;
  undefined8 local_1cf8;
  undefined8 uStack_1cf0;
  undefined8 local_1ce8;
  undefined8 uStack_1ce0;
  ulong local_1cd8;
  undefined8 uStack_1cd0;
  undefined8 local_1cc8;
  undefined8 uStack_1cc0;
  ulong local_1cb8;
  undefined8 uStack_1cb0;
  undefined8 local_1ca8;
  undefined8 uStack_1ca0;
  undefined8 local_1c98;
  undefined8 uStack_1c90;
  undefined8 local_1c88;
  undefined8 uStack_1c80;
  ulong local_1c78;
  undefined8 uStack_1c70;
  undefined8 local_1c68;
  undefined8 uStack_1c60;
  ulong local_1c58;
  undefined8 uStack_1c50;
  undefined8 local_1c48;
  undefined8 uStack_1c40;
  ulong local_1c38;
  undefined8 uStack_1c30;
  undefined8 local_1c28;
  undefined8 uStack_1c20;
  ulong local_1c18;
  undefined8 uStack_1c10;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  ulong local_1bd8;
  undefined8 uStack_1bd0;
  undefined8 local_1bc8;
  undefined8 uStack_1bc0;
  ulong local_1bb8;
  undefined8 uStack_1bb0;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  ulong local_1b98;
  undefined8 uStack_1b90;
  ulong local_1b88;
  undefined8 uStack_1b80;
  ulong local_1b78;
  undefined8 uStack_1b70;
  ulong local_1b68;
  undefined8 uStack_1b60;
  ulong local_1b58;
  undefined8 uStack_1b50;
  undefined8 local_1b48;
  undefined8 uStack_1b40;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  ulong uStack_1b00;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  float fStack_1ab0;
  undefined8 local_1a88;
  ulong uStack_1a80;
  undefined8 *local_1a70;
  undefined8 local_1a68;
  ulong uStack_1a60;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1a50;
  float local_1a48;
  float fStack_1a44;
  float fStack_1a40;
  float fStack_1a3c;
  undefined8 *local_1a30;
  float local_1a28;
  float fStack_1a24;
  float fStack_1a20;
  float fStack_1a1c;
  undefined8 *local_1a10;
  float local_1a08;
  float fStack_1a04;
  float fStack_1a00;
  float fStack_19fc;
  float *local_19f0;
  float *local_19b0;
  undefined8 *local_19a8;
  undefined8 *local_19a0;
  float local_1998;
  float fStack_1994;
  float fStack_1990;
  float fStack_198c;
  undefined8 *local_1988;
  embree *local_1950;
  embree *local_1948;
  undefined8 *local_1940;
  float local_1938;
  float fStack_1934;
  float fStack_1930;
  float fStack_192c;
  undefined8 *local_1928;
  undefined8 *local_1920;
  undefined8 *local_1918;
  undefined8 *local_1910;
  undefined4 local_1908;
  undefined4 uStack_1904;
  undefined4 uStack_1900;
  undefined4 uStack_18fc;
  undefined8 *local_18f8;
  undefined8 *local_18f0;
  undefined8 *local_18e8;
  undefined8 *local_18e0;
  float local_18d8;
  float fStack_18d4;
  float fStack_18d0;
  float fStack_18cc;
  undefined8 *local_18c8;
  undefined8 *local_18c0;
  undefined8 *local_18b8;
  undefined8 *local_18b0;
  float local_18a8;
  float fStack_18a4;
  float fStack_18a0;
  float fStack_189c;
  undefined8 *local_1898;
  undefined8 *local_1860;
  embree *local_1858;
  undefined8 *local_1850;
  float local_1848;
  float fStack_1844;
  float fStack_1840;
  float fStack_183c;
  undefined8 *local_1838;
  undefined8 *local_1830;
  undefined8 *local_1828;
  float *local_1820;
  float local_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float *local_1808;
  undefined8 *local_1800;
  undefined8 *local_17f8;
  undefined8 *local_17f0;
  float local_17e8;
  float fStack_17e4;
  float fStack_17e0;
  float fStack_17dc;
  undefined8 *local_17d8;
  undefined8 *local_17d0;
  undefined8 *local_17c8;
  undefined8 *local_17c0;
  float local_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  undefined8 *local_17a8;
  undefined8 *local_17a0;
  undefined8 *local_1798;
  undefined8 *local_1790;
  float local_1788;
  float fStack_1784;
  float fStack_1780;
  float fStack_177c;
  undefined8 *local_1778;
  float local_1738;
  float fStack_1734;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  undefined8 local_1708;
  undefined8 uStack_1700;
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined8 local_1698;
  undefined8 uStack_1690;
  float local_1668;
  float fStack_1664;
  float fStack_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1648;
  undefined8 uStack_1640;
  undefined8 local_1638;
  undefined8 uStack_1630;
  undefined8 local_1628;
  undefined8 uStack_1620;
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  float local_15e8;
  float fStack_15e4;
  float fStack_15e0;
  float fStack_15dc;
  float fStack_15d0;
  float local_15b8;
  float fStack_15b4;
  float fStack_15b0;
  float fStack_15ac;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined1 local_1588 [16];
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined1 local_1568 [8];
  ulong uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined4 local_153c;
  undefined1 *local_1538;
  undefined1 *local_1530;
  undefined8 local_1528;
  undefined8 uStack_1520;
  undefined8 local_1518;
  ulong uStack_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 local_14f8;
  ulong uStack_14f0;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined4 local_14cc;
  undefined8 *local_14c8;
  undefined8 *local_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  ulong uStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  ulong uStack_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined4 local_145c;
  undefined8 *local_1458;
  undefined8 *local_1450;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  ulong uStack_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 local_1418;
  ulong uStack_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined4 local_13ec;
  undefined8 *local_13e8;
  undefined8 *local_13e0;
  undefined1 *local_13d8;
  float *local_13d0;
  undefined4 local_13c8;
  undefined4 local_13c4;
  undefined4 local_13c0;
  undefined4 local_13bc;
  undefined8 *local_13b8;
  undefined4 local_13b0;
  undefined4 local_13ac;
  undefined4 local_13a8;
  undefined4 local_13a4;
  undefined8 *local_13a0;
  undefined4 local_1398;
  undefined4 local_1394;
  undefined4 local_1390;
  undefined4 local_138c;
  undefined8 *local_1388;
  undefined4 local_1380;
  undefined4 local_137c;
  undefined4 local_1378;
  undefined4 local_1374;
  undefined8 *local_1370;
  undefined8 *local_1368;
  undefined8 *local_1360;
  undefined8 *local_1358;
  undefined8 *local_1350;
  undefined8 *local_1348;
  undefined8 *local_1340;
  undefined8 *local_1338;
  undefined8 *local_1330;
  undefined8 *local_1328;
  undefined8 *local_1320;
  undefined8 *local_1318;
  undefined8 *local_1310;
  undefined8 *local_1308;
  undefined1 *local_1300;
  undefined8 *local_12f8;
  undefined1 *local_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 *local_12a8;
  undefined8 *local_12a0;
  undefined8 *local_1298;
  undefined8 *local_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 *local_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 *local_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 *local_1230;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 *local_1210;
  ulong uStack_1200;
  undefined1 *local_11f0;
  undefined8 local_11e8;
  ulong uStack_11e0;
  undefined8 *local_11d0;
  undefined8 local_11c8;
  ulong uStack_11c0;
  undefined8 *local_11b0;
  undefined8 local_11a8;
  ulong uStack_11a0;
  undefined8 *local_1190;
  undefined8 local_1188;
  ulong uStack_1180;
  undefined8 *local_1170;
  undefined8 local_1168;
  ulong uStack_1160;
  undefined8 *local_1150;
  undefined8 local_1148;
  ulong uStack_1140;
  undefined8 *local_1130;
  undefined1 *local_1110;
  undefined4 local_1104;
  undefined8 *local_1100;
  undefined4 local_10f4;
  undefined8 *local_10f0;
  undefined4 local_10e4;
  undefined8 *local_10e0;
  undefined4 local_10d4;
  undefined8 *local_10d0;
  undefined8 *local_10c8;
  undefined8 *local_10c0;
  undefined8 *local_10b8;
  undefined1 *local_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined4 local_1098;
  undefined4 local_1094;
  undefined4 local_1090;
  undefined4 local_108c;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined4 local_1078;
  undefined4 local_1074;
  undefined4 local_1070;
  undefined4 local_106c;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined4 local_1058;
  undefined4 local_1054;
  undefined4 local_1050;
  undefined4 local_104c;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined4 local_1038;
  undefined4 local_1034;
  undefined4 local_1030;
  undefined4 local_102c;
  undefined4 local_1028;
  undefined4 uStack_1024;
  undefined4 uStack_1020;
  undefined4 uStack_101c;
  ulong uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  ulong uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  ulong uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  ulong uStack_fb0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  ulong uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  ulong uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  ulong uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 *local_f28;
  undefined8 *local_f20;
  undefined8 *local_f18;
  undefined8 *local_f10;
  undefined8 *local_f08;
  undefined8 *local_f00;
  undefined8 *local_ef8;
  undefined8 *local_ef0;
  undefined8 *local_ee8;
  undefined1 *local_ee0;
  undefined8 *local_ed8;
  undefined8 *local_ed0;
  undefined8 *local_ec8;
  undefined8 *local_ec0;
  undefined8 *local_eb8;
  undefined8 *local_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined4 local_e28;
  undefined4 uStack_e24;
  undefined4 uStack_e20;
  undefined4 uStack_e1c;
  undefined4 local_e0c;
  undefined4 local_e08;
  undefined4 uStack_e04;
  undefined4 uStack_e00;
  undefined4 uStack_dfc;
  undefined4 local_dec;
  undefined4 local_de8;
  undefined4 uStack_de4;
  undefined4 uStack_de0;
  undefined4 uStack_ddc;
  undefined4 local_dcc;
  undefined4 local_dc8;
  undefined4 uStack_dc4;
  undefined4 uStack_dc0;
  undefined4 uStack_dbc;
  undefined4 local_dac;
  undefined4 local_da8;
  undefined4 uStack_da4;
  undefined4 uStack_da0;
  undefined4 uStack_d9c;
  undefined4 local_d8c;
  float local_d68;
  float fStack_d64;
  float fStack_d60;
  float fStack_d5c;
  float local_d4c;
  float local_d48;
  float fStack_d44;
  float fStack_d40;
  float fStack_d3c;
  float local_d2c;
  float local_d28;
  float fStack_d24;
  float fStack_d20;
  float fStack_d1c;
  float local_d0c;
  undefined4 local_ce8;
  undefined4 uStack_ce4;
  undefined4 uStack_ce0;
  undefined4 uStack_cdc;
  undefined4 local_cd8;
  float local_ca8;
  float fStack_ca4;
  float fStack_ca0;
  float fStack_c9c;
  float local_c8c;
  float local_c88;
  float fStack_c84;
  float fStack_c80;
  float fStack_c7c;
  float local_c6c;
  float local_c68;
  float fStack_c64;
  float fStack_c60;
  float fStack_c5c;
  undefined8 *local_c58;
  undefined8 *local_c50;
  undefined1 *local_c48;
  undefined8 *local_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  float local_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  undefined8 *local_c00;
  float local_bf4;
  undefined1 *local_bf0;
  float local_be8;
  float fStack_be4;
  float fStack_be0;
  float fStack_bdc;
  float local_bcc;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  float *local_bb8;
  undefined1 *local_bb0;
  float local_ba8;
  float fStack_ba4;
  float fStack_ba0;
  float fStack_b9c;
  undefined1 *local_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined4 local_b6c;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined4 local_b58;
  undefined4 local_b54;
  undefined4 local_b50;
  undefined4 local_b4c;
  undefined8 local_b48;
  undefined8 uStack_b40;
  float local_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 *local_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 *local_aa8;
  undefined8 *local_aa0;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 *local_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 *local_988;
  undefined8 *local_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 *local_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 *local_8f8;
  undefined8 *local_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 *local_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 *local_860;
  undefined8 *local_858;
  undefined8 *local_850;
  undefined8 *local_848;
  undefined8 *local_840;
  undefined8 *local_838;
  undefined8 *local_830;
  undefined8 *local_828;
  undefined8 *local_810;
  undefined8 *local_808;
  undefined8 *local_800;
  undefined8 *local_7f8;
  undefined8 *local_7f0;
  undefined8 *local_7e8;
  undefined8 *local_7e0;
  undefined8 *local_7d8;
  undefined8 *local_7c0;
  undefined8 *local_7b8;
  undefined8 *local_7b0;
  undefined8 *local_7a8;
  undefined8 *local_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  float local_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  undefined8 *local_768;
  undefined8 *local_760;
  undefined8 *local_758;
  undefined8 *local_750;
  undefined8 *local_748;
  undefined8 *local_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  float local_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  undefined8 *local_708;
  undefined8 *local_700;
  undefined8 *local_6f8;
  undefined8 *local_6f0;
  undefined8 *local_6e8;
  undefined8 *local_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined4 local_6b8;
  undefined4 uStack_6b4;
  undefined4 uStack_6b0;
  undefined4 uStack_6ac;
  undefined8 *local_6a8;
  undefined8 *local_6a0;
  undefined8 *local_698;
  undefined8 *local_690;
  undefined8 *local_688;
  undefined8 *local_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined4 local_658;
  undefined4 uStack_654;
  undefined4 uStack_650;
  undefined4 uStack_64c;
  undefined8 *local_648;
  undefined8 *local_640;
  undefined8 *local_638;
  undefined8 *local_630;
  undefined8 *local_628;
  undefined8 *local_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  undefined8 *local_5e8;
  undefined8 *local_5e0;
  undefined8 *local_5d8;
  undefined8 *local_5d0;
  undefined8 *local_5c8;
  undefined8 *local_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  undefined8 *local_588;
  undefined8 *local_580;
  undefined8 *local_578;
  undefined8 *local_4b0;
  undefined8 *local_4a8;
  undefined8 *local_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined8 *local_468;
  undefined8 *local_460;
  undefined8 *local_458;
  undefined8 *local_450;
  undefined8 *local_448;
  undefined8 *local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined8 *local_400;
  undefined8 *local_3f8;
  undefined8 *local_3f0;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 *local_3b8;
  undefined8 *local_3b0;
  undefined8 *local_368;
  undefined8 *local_360;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 *local_338;
  undefined8 *local_330;
  undefined8 *local_328;
  undefined8 *local_320;
  undefined4 local_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 *local_2f8;
  undefined8 *local_2f0;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 *local_2b8;
  undefined8 *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 *local_258;
  undefined8 *local_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 *local_228;
  undefined8 *local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 *local_188;
  undefined8 *local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 *local_168;
  undefined8 *local_160;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 *local_138;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 *local_118;
  undefined8 *local_110;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  float local_c4;
  float local_c0;
  float local_9c;
  float local_98;
  float local_74;
  float local_70;
  float local_6c;
  float *local_68;
  float *local_60;
  float *local_58;
  float *local_50;
  float *local_48;
  float *local_40;
  float *local_38;
  float *local_30;
  float *local_28;
  float *local_20;
  float local_18;
  float local_c;
  
  local_2740 = (undefined8 *)((long)in_stack_00000008 + 0x24);
  local_2170 = *(uint *)((long)in_stack_00000008 + 0x2c);
  local_2178 = *(undefined4 *)local_2740;
  local_2174 = *(undefined4 *)(in_stack_00000008 + 5);
  local_2188 = *local_2740;
  local_216c = 0;
  uStack_2180 = (ulong)local_2170;
  local_25f4 = (float)in_ESI;
  local_2728 = &local_2898;
  local_2190 = *(uint *)(in_stack_00000008 + 1);
  local_2198 = *(undefined4 *)in_stack_00000008;
  local_2194 = *(undefined4 *)((long)in_stack_00000008 + 4);
  local_21a8 = *in_stack_00000008;
  local_218c = 0;
  uStack_21a0 = (ulong)local_2190;
  local_2688 = &local_2888;
  local_2558 = &local_2618;
  local_16e8 = CONCAT44(local_25f4,local_25f4);
  uStack_16e0 = CONCAT44(local_25f4,local_25f4);
  local_16f8 = (float)local_2898;
  fStack_16f4 = (float)((ulong)local_2898 >> 0x20);
  fStack_16f0 = (float)uStack_2890;
  fStack_16ec = (float)(uStack_2890 >> 0x20);
  local_17b8 = local_25f4 * local_16f8;
  fStack_17b4 = local_25f4 * fStack_16f4;
  fStack_17b0 = local_25f4 * fStack_16f0;
  fStack_17ac = local_25f4 * fStack_16ec;
  local_1b18 = CONCAT44(fStack_17b4,local_17b8);
  uStack_1b10 = CONCAT44(fStack_17ac,fStack_17b0);
  local_2624 = (float)in_EDX;
  local_2720 = (undefined8 *)((long)in_stack_00000008 + 0xc);
  local_2718 = &local_28b8;
  local_21b0 = *(uint *)((long)in_stack_00000008 + 0x14);
  local_21b8 = *(undefined4 *)local_2720;
  local_21b4 = *(undefined4 *)(in_stack_00000008 + 2);
  local_21c8 = *local_2720;
  local_21ac = 0;
  uStack_21c0 = (ulong)local_21b0;
  local_2690 = &local_28a8;
  local_2548 = &local_2648;
  local_1708 = CONCAT44(local_2624,local_2624);
  uStack_1700 = CONCAT44(local_2624,local_2624);
  local_1718 = (float)local_28b8;
  fStack_1714 = (float)((ulong)local_28b8 >> 0x20);
  fStack_1710 = (float)uStack_28b0;
  fStack_170c = (float)(uStack_28b0 >> 0x20);
  local_1788 = local_2624 * local_1718;
  fStack_1784 = local_2624 * fStack_1714;
  fStack_1780 = local_2624 * fStack_1710;
  fStack_177c = local_2624 * fStack_170c;
  local_1b28 = CONCAT44(fStack_1784,local_1788);
  uStack_1b20 = CONCAT44(fStack_177c,fStack_1780);
  local_26a0 = &local_2878;
  local_1a48 = local_17b8 + local_1788;
  fStack_1a44 = fStack_17b4 + fStack_1784;
  fStack_1a40 = fStack_17b0 + fStack_1780;
  fStack_1a3c = fStack_17ac + fStack_177c;
  local_1af8 = CONCAT44(fStack_1a44,local_1a48);
  uStack_1af0 = CONCAT44(fStack_1a3c,fStack_1a40);
  local_2710 = in_stack_00000008 + 3;
  local_2708 = &local_28c8;
  local_21d0 = *(float *)(in_stack_00000008 + 4);
  local_21d8 = *(undefined4 *)local_2710;
  local_21d4 = *(undefined4 *)((long)in_stack_00000008 + 0x1c);
  local_21e8 = *local_2710;
  local_21cc = 0;
  uStack_21e0 = (ulong)(uint)local_21d0;
  local_2750 = &local_2868;
  local_1b08._0_4_ = (float)local_21e8;
  local_1b08._4_4_ = (float)((ulong)local_21e8 >> 0x20);
  local_1a28 = local_1a48 + (float)local_1b08;
  fStack_1a24 = fStack_1a44 + local_1b08._4_4_;
  fStack_1a20 = fStack_1a40 + local_21d0;
  fStack_1a1c = fStack_1a3c + 0.0;
  local_16c8 = CONCAT44(fStack_1a24,local_1a28);
  uStack_16c0 = CONCAT44(fStack_1a1c,fStack_1a20);
  local_18e0 = &local_22a8;
  local_18d8 = local_1a28 * local_1a28;
  fStack_18d4 = fStack_1a24 * fStack_1a24;
  fStack_18d0 = fStack_1a20 * fStack_1a20;
  fStack_18cc = fStack_1a1c * fStack_1a1c;
  local_878 = CONCAT44(fStack_18d4,local_18d8);
  uStack_870 = CONCAT44(fStack_18cc,fStack_18d0);
  local_860 = &local_8a8;
  local_848 = &local_8b8;
  local_738 = CONCAT44(fStack_18d4,fStack_18d4);
  uStack_730 = CONCAT44(fStack_18d4,fStack_18d4);
  local_7f8 = &local_8c8;
  local_798 = CONCAT44(fStack_18d0,fStack_18d0);
  uStack_790 = CONCAT44(fStack_18d0,fStack_18d0);
  local_7a8 = &local_8e8;
  local_718 = local_18d8 + fStack_18d4;
  fStack_714 = fStack_18d4 + fStack_18d4;
  fStack_710 = fStack_18d0 + fStack_18d4;
  fStack_70c = fStack_18cc + fStack_18d4;
  local_788 = CONCAT44(fStack_714,local_718);
  uStack_780 = CONCAT44(fStack_70c,fStack_710);
  local_858 = &local_8d8;
  local_20cc = local_718 + fStack_18d0;
  fStack_774 = fStack_714 + fStack_18d0;
  fStack_770 = fStack_710 + fStack_18d0;
  fStack_76c = fStack_70c + fStack_18d0;
  local_888 = CONCAT44(fStack_774,local_20cc);
  uStack_880 = CONCAT44(fStack_76c,fStack_770);
  local_1f48 = ZEXT416((uint)local_20cc);
  local_20e8 = CONCAT44(0,local_20cc);
  uStack_20e0 = 0;
  uStack_1ea0 = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_20e8;
  local_20f8 = rsqrtss(auVar2,auVar2);
  local_1f4c = 0x3fc00000;
  local_1f68 = ZEXT416(0x3fc00000);
  local_1c48 = local_20f8._0_8_;
  uVar4 = local_1c48;
  uStack_1c40 = local_20f8._8_8_;
  local_1c48._0_4_ = local_20f8._0_4_;
  local_1c38 = (ulong)(uint)((float)local_1c48 * 1.5);
  uStack_1c30 = 0;
  local_1f6c = 0xbf000000;
  local_1f88 = ZEXT416(0xbf000000);
  local_1c68 = local_1f88._0_8_;
  uStack_1c60 = 0;
  local_1c58 = (ulong)(uint)(local_20cc * -0.5);
  uStack_1c50 = 0;
  local_1c88 = local_20f8._0_8_;
  uStack_1c80 = local_20f8._8_8_;
  local_24cc = local_20cc * -0.5 * (float)local_1c48;
  local_1c78 = (ulong)(uint)local_24cc;
  uStack_1c70 = 0;
  local_1ca8 = local_20f8._0_8_;
  uStack_1ca0 = local_20f8._8_8_;
  local_1c98 = CONCAT44(local_20f8._4_4_,(float)local_1c48 * (float)local_1c48);
  uStack_1c90 = local_20f8._8_8_;
  local_1cc8 = local_1c98;
  uStack_1cc0 = local_20f8._8_8_;
  local_24cc = local_24cc * (float)local_1c48 * (float)local_1c48;
  local_1cb8 = (ulong)(uint)local_24cc;
  uStack_1cb0 = 0;
  local_1e48 = local_1cb8;
  uStack_1e40 = 0;
  local_24cc = (float)local_1c48 * 1.5 + local_24cc;
  local_1e38 = (ulong)(uint)local_24cc;
  uStack_1e30 = 0;
  local_2108 = local_1e38;
  uStack_2100 = 0;
  local_1b68 = local_1e38;
  uStack_1b60 = 0;
  local_24b0 = &local_24e8;
  local_16d8 = CONCAT44(local_24cc,local_24cc);
  uStack_16d0 = CONCAT44(local_24cc,local_24cc);
  local_17e8 = local_1a28 * local_24cc;
  fStack_17e4 = fStack_1a24 * local_24cc;
  fStack_17e0 = fStack_1a20 * local_24cc;
  fStack_17dc = fStack_1a1c * local_24cc;
  local_2858 = CONCAT44(fStack_17e4,local_17e8);
  uStack_2850 = CONCAT44(fStack_17dc,fStack_17e0);
  local_25e0 = &inf;
  local_27c4 = in_R8D;
  local_27c0 = in_RCX;
  local_27b8 = in_EDX;
  local_27b4 = in_ESI;
  local_27b0 = in_RDI;
  local_2748 = &local_2858;
  local_2738 = &local_2848;
  local_26a8 = local_2708;
  local_2698 = local_2750;
  local_2680 = local_26a0;
  local_2630 = local_2718;
  local_2620 = local_2690;
  local_2600 = local_2728;
  local_25f0 = local_2688;
  local_255c = local_25f4;
  local_254c = local_2624;
  local_24c8 = local_2750;
  local_24c0 = &local_2858;
  local_24b4 = local_24cc;
  local_2298 = local_2750;
  local_2290 = local_2750;
  local_1f2c = local_20cc;
  local_1ea8 = local_20e8;
  local_1c48 = uVar4;
  local_1b08 = local_21e8;
  uStack_1b00 = uStack_21e0;
  local_1a30 = local_26a0;
  local_1a10 = local_2750;
  local_18f0 = local_2750;
  local_18e8 = local_2750;
  local_18c8 = local_18e0;
  local_1800 = local_24b0;
  local_17f8 = local_2750;
  local_17f0 = &local_2858;
  local_17d8 = &local_2858;
  local_17d0 = local_2728;
  local_17c8 = local_2558;
  local_17c0 = local_2688;
  local_17a8 = local_2688;
  local_17a0 = local_2718;
  local_1798 = local_2548;
  local_1790 = local_2690;
  local_1778 = local_2690;
  local_1638 = local_16c8;
  uStack_1630 = uStack_16c0;
  local_1628 = local_16c8;
  uStack_1620 = uStack_16c0;
  local_d28 = local_24cc;
  fStack_d24 = local_24cc;
  fStack_d20 = local_24cc;
  fStack_d1c = local_24cc;
  local_d0c = local_24cc;
  local_ca8 = local_2624;
  fStack_ca4 = local_2624;
  fStack_ca0 = local_2624;
  fStack_c9c = local_2624;
  local_c8c = local_2624;
  local_c88 = local_25f4;
  fStack_c84 = local_25f4;
  fStack_c80 = local_25f4;
  fStack_c7c = local_25f4;
  local_c6c = local_25f4;
  local_890 = local_18e0;
  local_850 = local_860;
  local_800 = local_860;
  local_7b0 = local_7f8;
  local_7a0 = local_858;
  local_778 = local_20cc;
  local_768 = local_858;
  local_760 = local_7f8;
  local_758 = local_7a8;
  local_750 = local_848;
  local_748 = local_860;
  local_740 = local_7a8;
  local_728 = local_878;
  uStack_720 = uStack_870;
  local_708 = local_7a8;
  local_700 = local_848;
  local_6f8 = local_860;
  local_2e8 = local_860;
  local_2e0 = local_848;
  local_2d8 = fStack_18d4;
  fStack_2d4 = fStack_18d4;
  fStack_2d0 = fStack_18d4;
  fStack_2cc = fStack_18d4;
  local_2c8 = local_738;
  uStack_2c0 = uStack_730;
  local_2b8 = local_848;
  local_2b0 = local_860;
  local_2a8 = local_878;
  uStack_2a0 = uStack_870;
  local_118 = local_860;
  local_110 = local_7f8;
  local_108 = fStack_18d0;
  fStack_104 = fStack_18d0;
  fStack_100 = fStack_18d0;
  fStack_fc = fStack_18d0;
  local_f8 = local_798;
  uStack_f0 = uStack_790;
  local_e8 = local_7f8;
  local_e0 = local_860;
  local_d8 = local_878;
  uStack_d0 = uStack_870;
  local_28c8 = local_21e8;
  uStack_28c0 = uStack_21e0;
  local_28b8 = local_21c8;
  uStack_28b0 = uStack_21c0;
  local_28a8 = local_1b28;
  uStack_28a0 = uStack_1b20;
  local_2898 = local_21a8;
  uStack_2890 = uStack_21a0;
  local_2888 = local_1b18;
  uStack_2880 = uStack_1b10;
  local_2878 = local_1af8;
  uStack_2870 = uStack_1af0;
  local_2868 = local_16c8;
  uStack_2860 = uStack_16c0;
  local_2848 = local_2188;
  uStack_2840 = uStack_2180;
  local_2648 = local_1708;
  uStack_2640 = uStack_1700;
  local_2618 = local_16e8;
  uStack_2610 = uStack_16e0;
  local_24e8 = local_16d8;
  uStack_24e0 = uStack_16d0;
  local_22a8 = local_878;
  uStack_22a0 = uStack_870;
  local_8e8 = local_788;
  uStack_8e0 = uStack_780;
  local_8d8 = local_888;
  uStack_8d0 = uStack_880;
  local_8c8 = local_798;
  uStack_8c0 = uStack_790;
  local_8b8 = local_738;
  uStack_8b0 = uStack_730;
  local_8a8 = local_878;
  uStack_8a0 = uStack_870;
  local_2818 = std::numeric_limits<float>::infinity();
  local_25b0 = &local_2838;
  local_25c4 = 0;
  local_25cc = 0;
  local_25d0 = 0xffffffff;
  local_25d4 = 0xffffffff;
  local_25d8 = 0xffffffff;
  local_13ec = 0;
  local_13b8 = &local_1408;
  local_13bc = 0xffffffff;
  local_13c0 = 0xffffffff;
  local_13c4 = 0xffffffff;
  local_13c8 = 0;
  local_102c = 0;
  local_1030 = 0xffffffff;
  local_1034 = 0xffffffff;
  local_1038 = 0xffffffff;
  local_1048 = 0xffffffffffffffff;
  uStack_1040 = 0xffffffff;
  local_1408 = 0xffffffffffffffff;
  uStack_1400 = 0xffffffff;
  local_12e8 = 0xffffffffffffffff;
  uStack_12e0 = 0xffffffff;
  local_1358 = &local_1428;
  local_1428 = 0xffffffffffffffff;
  uStack_1420 = 0xffffffff;
  local_11a8 = local_2848;
  uStack_1180 = uStack_2840;
  local_1360 = &local_1438;
  local_1368 = &local_1448;
  local_1104 = 0;
  local_dac = 0;
  local_dc8 = 0;
  uStack_dc4 = 0;
  uStack_dc0 = 0;
  uStack_dbc = 0;
  local_e48 = 0;
  uStack_e40 = 0;
  local_1350 = &local_1418;
  local_f38 = 0xffffffffffffffff;
  uStack_f30 = 0xffffffff;
  uStack_11a0 = uStack_2840 & 0xffffffff;
  local_e38 = 0xffffffffffffffff;
  uStack_e30 = 0xffffffff;
  local_fc8 = 0;
  uStack_fc0 = 0;
  local_1450 = &local_2828;
  local_145c = 0;
  local_13a0 = &local_1478;
  local_13a4 = 0xffffffff;
  local_13a8 = 0xffffffff;
  local_13ac = 0xffffffff;
  local_13b0 = 0;
  local_104c = 0;
  local_1050 = 0xffffffff;
  local_1054 = 0xffffffff;
  local_1058 = 0xffffffff;
  local_1068 = 0xffffffffffffffff;
  uStack_1060 = 0xffffffff;
  local_1478 = 0xffffffffffffffff;
  uStack_1470 = 0xffffffff;
  local_12d8 = 0xffffffffffffffff;
  uStack_12d0 = 0xffffffff;
  local_1338 = &local_1498;
  local_1498 = 0xffffffffffffffff;
  uStack_1490 = 0xffffffff;
  local_11c8 = local_2858;
  uStack_1160 = uStack_2850;
  local_1340 = &local_14a8;
  local_1348 = &local_14b8;
  local_10f4 = 0;
  local_dcc = 0;
  local_de8 = 0;
  uStack_de4 = 0;
  uStack_de0 = 0;
  uStack_ddc = 0;
  local_e68 = 0;
  uStack_e60 = 0;
  local_1330 = &local_1488;
  local_f58 = 0xffffffffffffffff;
  uStack_f50 = 0xffffffff;
  uStack_11c0 = uStack_2850 & 0xffffffff;
  local_e58 = 0xffffffffffffffff;
  uStack_e50 = 0xffffffff;
  local_fe8 = 0;
  uStack_fe0 = 0;
  local_2814 = 0xffffffff;
  local_13d0 = &local_2808;
  local_27f4 = 0xffffffff;
  local_27f0 = -1;
  local_27ec = 0xffffffff;
  local_27e8 = 0xffffffff;
  local_2578 = &local_28e8;
  local_28e8 = 0;
  local_28e0 = 0;
  local_28d8 = 0;
  local_28d0 = 0;
  local_28e4 = 0x700002;
  local_25c8 = local_2818;
  local_25c0 = &local_2858;
  local_25b8 = &local_2848;
  local_2570 = local_25b0;
  local_1458 = &local_2858;
  local_13e8 = &local_2848;
  local_13e0 = local_25b0;
  local_12a8 = local_13b8;
  local_12a0 = local_13a0;
  local_1288 = local_12e8;
  uStack_1280 = uStack_12e0;
  local_1270 = local_1358;
  local_1268 = local_12d8;
  uStack_1260 = uStack_12d0;
  local_1250 = local_1338;
  local_11b0 = local_1330;
  local_1190 = local_1350;
  local_1188 = local_11a8;
  local_1170 = local_1360;
  local_1168 = local_11c8;
  local_1150 = local_1340;
  local_1100 = local_1368;
  local_10f0 = local_1348;
  local_10c8 = local_1350;
  local_10c0 = local_1330;
  local_fd8 = local_11c8;
  uStack_fd0 = uStack_11c0;
  local_fb8 = local_11a8;
  uStack_fb0 = uStack_11a0;
  local_f68 = local_11c8;
  uStack_f60 = uStack_1160;
  local_f48 = local_11a8;
  uStack_f40 = uStack_1180;
  local_f08 = local_1338;
  local_f00 = local_1338;
  local_ef8 = local_1358;
  local_ef0 = local_1358;
  local_ec8 = local_1348;
  local_ec0 = local_1340;
  local_eb8 = local_1368;
  local_eb0 = local_1360;
  local_2838 = local_11a8;
  uStack_2830 = uStack_11a0;
  local_2828 = local_11c8;
  uStack_2820 = uStack_11c0;
  local_14b8 = local_e68;
  uStack_14b0 = uStack_e60;
  local_14a8 = local_11c8;
  uStack_14a0 = uStack_1160;
  local_1488 = local_11c8;
  uStack_1480 = uStack_11c0;
  local_1448 = local_e48;
  uStack_1440 = uStack_e40;
  local_1438 = local_11a8;
  uStack_1430 = uStack_1180;
  local_1418 = local_11a8;
  uStack_1410 = uStack_11a0;
  rtcTraversableIntersect1(*(undefined8 *)(local_27b0 + 8),local_25b0);
  local_2568 = in_stack_00000010;
  *in_stack_00000010 = *in_stack_00000010 + 1;
  local_2528 = &local_28f8;
  local_252c = 0;
  local_cd8 = 0;
  local_ce8 = 0;
  uStack_ce4 = 0;
  uStack_ce0 = 0;
  uStack_cdc = 0;
  local_28f8 = 0.0;
  fStack_28f4 = 0.0;
  uStack_28f0._0_4_ = 0.0;
  if (local_27f0 != -1) {
    if (local_27f0 == 0) {
      local_2b14 = 0;
    }
    else {
      local_2b14 = local_27f4;
    }
    local_2510 = (undefined8 *)(*(long *)(local_27b0 + 0x10) + (ulong)local_2b14 * 0x10);
    local_2508 = &local_2908;
    local_2908 = *local_2510;
    uStack_2900 = local_2510[1];
    local_24f8 = &local_2808;
    local_2700 = local_2924;
    local_c = local_2800 * local_2800;
    local_18 = local_2804 * local_2804 + local_c;
    local_210c = local_2808 * local_2808 + local_18;
    local_1ee8._4_4_ = 0;
    local_1ee8._0_4_ = local_210c;
    local_2128 = local_1ee8._0_8_;
    uStack_2120 = 0;
    local_1e98 = local_1ee8._0_8_;
    uStack_1e90 = 0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_1ee8._0_8_;
    local_2138 = rsqrtss(auVar3,auVar3);
    local_1eec = 0x3fc00000;
    local_1f08 = ZEXT416(0x3fc00000);
    local_1ba8 = local_2138._0_8_;
    uVar5 = local_1ba8;
    uStack_1ba0 = local_2138._8_8_;
    local_1ba8._0_4_ = local_2138._0_4_;
    local_1b98 = (ulong)(uint)((float)local_1ba8 * 1.5);
    uStack_1b90 = 0;
    local_1f0c = 0xbf000000;
    local_1f28 = ZEXT416(0xbf000000);
    local_1bc8 = local_1f28._0_8_;
    uStack_1bc0 = 0;
    local_1bb8 = (ulong)(uint)(local_210c * -0.5);
    uStack_1bb0 = 0;
    local_1be8 = local_2138._0_8_;
    uStack_1be0 = local_2138._8_8_;
    local_24fc = local_210c * -0.5 * (float)local_1ba8;
    local_1bd8 = (ulong)(uint)local_24fc;
    uStack_1bd0 = 0;
    local_1c08 = local_2138._0_8_;
    uStack_1c00 = local_2138._8_8_;
    local_1bf8 = CONCAT44(local_2138._4_4_,(float)local_1ba8 * (float)local_1ba8);
    uStack_1bf0 = local_2138._8_8_;
    local_1c28 = local_1bf8;
    uStack_1c20 = local_2138._8_8_;
    local_24fc = local_24fc * (float)local_1ba8 * (float)local_1ba8;
    local_1c18 = (ulong)(uint)local_24fc;
    uStack_1c10 = 0;
    local_1e28 = local_1c18;
    uStack_1e20 = 0;
    local_24fc = (float)local_1ba8 * 1.5 + local_24fc;
    local_1e18 = (ulong)(uint)local_24fc;
    uStack_1e10 = 0;
    local_2148 = local_1e18;
    uStack_2140 = 0;
    local_1b58 = local_1e18;
    uStack_1b50 = 0;
    local_68 = &local_24fc;
    local_21f8 = local_2808 * local_24fc;
    local_38 = &local_6c;
    local_40 = &local_70;
    local_48 = &local_74;
    local_2918.m128[1] = local_70;
    local_26f8 = &local_2918;
    local_21ec = 0;
    uStack_2200 = (ulong)(uint)local_74;
    local_26c0 = &local_2948;
    local_23d4 = 0x3f000000;
    local_23b8 = &local_23e8;
    local_23bc = 0x3f000000;
    local_d8c = 0x3f000000;
    local_da8 = 0x3f000000;
    uStack_da4 = 0x3f000000;
    uStack_da0 = 0x3f000000;
    uStack_d9c = 0x3f000000;
    local_23e8 = 0x3f0000003f000000;
    uStack_23e0 = 0x3f0000003f000000;
    local_1658 = 0x3f0000003f000000;
    uStack_1650 = 0x3f0000003f000000;
    local_1648._0_4_ = (float)local_2908;
    local_1648._4_4_ = (float)((ulong)local_2908 >> 0x20);
    uStack_1640._0_4_ = (float)uStack_2900;
    uStack_1640._4_4_ = (float)((ulong)uStack_2900 >> 0x20);
    local_18a8 = (float)local_1648 * 0.5;
    fStack_18a4 = local_1648._4_4_ * 0.5;
    fStack_18a0 = (float)uStack_1640 * 0.5;
    fStack_189c = uStack_1640._4_4_ * 0.5;
    local_1ae8 = CONCAT44(fStack_18a4,local_18a8);
    uStack_1ae0 = CONCAT44(fStack_189c,fStack_18a0);
    local_2780 = &local_2938;
    local_2778 = &local_28f8;
    local_1ad8 = 0;
    uStack_1ad0 = 0;
    local_1a08 = local_18a8 + 0.0;
    fStack_1a04 = fStack_18a4 + 0.0;
    fStack_1a00 = fStack_18a0 + 0.0;
    fStack_19fc = fStack_189c + 0.0;
    uStack_2930 = CONCAT44(fStack_19fc,fStack_1a00);
    local_2798 = &local_2968;
    local_279c = 0xbf800000;
    local_27a0 = 0xbf800000;
    local_27a4 = 0xbf800000;
    local_214c = 0;
    local_2150 = 0xbf800000;
    local_2154 = 0xbf800000;
    local_2158 = 0xbf800000;
    local_2168 = 0xbf800000bf800000;
    uStack_2160 = 0xbf800000;
    local_2968 = 0xbf800000bf800000;
    uStack_2960 = 0xbf800000;
    local_2758 = &local_2958;
    local_1910 = &local_2288;
    local_1608 = 0xbf800000bf800000;
    uStack_1600 = 0xbf800000;
    local_1618 = 0xbf800000bf800000;
    uStack_1610 = 0xbf800000;
    local_1908 = 0x3f800000;
    uStack_1904 = 0x3f800000;
    uStack_1900 = 0x3f800000;
    uStack_18fc = 0;
    local_908 = 0x3f8000003f800000;
    uStack_900 = 0x3f800000;
    local_8f8 = &local_938;
    local_838 = &local_948;
    local_678 = 0x3f8000003f800000;
    uStack_670 = 0x3f8000003f800000;
    local_7e8 = &local_958;
    local_6d8 = 0x3f8000003f800000;
    uStack_6d0 = 0x3f8000003f800000;
    local_6e8 = &local_978;
    local_658 = 0x40000000;
    uStack_654 = 0x40000000;
    uStack_650 = 0x40000000;
    uStack_64c = 0x3f800000;
    local_6c8 = 0x4000000040000000;
    uStack_6c0 = 0x3f80000040000000;
    local_8f0 = &local_968;
    local_208c = 0x40400000;
    uStack_6b4 = 0x40400000;
    uStack_6b0 = 0x40400000;
    uStack_6ac = 0x40000000;
    local_918 = 0x4040000040400000;
    uStack_910 = 0x4000000040400000;
    local_1fa8 = ZEXT416(0x40400000);
    local_20a8 = 0x40400000;
    uStack_20a0 = 0;
    local_1eb8 = 0x40400000;
    uStack_1eb0 = 0;
    local_20b8 = rsqrtss(ZEXT816(0x40400000),ZEXT816(0x40400000));
    local_1fac = 0x3fc00000;
    local_1fc8 = ZEXT416(0x3fc00000);
    local_1ce8 = local_20b8._0_8_;
    uVar4 = local_1ce8;
    uStack_1ce0 = local_20b8._8_8_;
    local_1ce8._0_4_ = local_20b8._0_4_;
    local_1cd8 = (ulong)(uint)((float)local_1ce8 * 1.5);
    uStack_1cd0 = 0;
    local_1fcc = 0xbf000000;
    local_1fe8 = ZEXT416(0xbf000000);
    local_1d08 = local_1fe8._0_8_;
    uStack_1d00 = 0;
    local_1cf8 = 0xbfc00000;
    uStack_1cf0 = 0;
    local_1d28 = local_20b8._0_8_;
    uStack_1d20 = local_20b8._8_8_;
    local_1d18 = (ulong)(uint)((float)local_1ce8 * -1.5);
    uStack_1d10 = 0;
    local_1d48 = local_20b8._0_8_;
    uStack_1d40 = local_20b8._8_8_;
    local_1d38 = CONCAT44(local_20b8._4_4_,(float)local_1ce8 * (float)local_1ce8);
    uStack_1d30 = local_20b8._8_8_;
    local_1d68 = local_1d38;
    uStack_1d60 = local_20b8._8_8_;
    local_248c = (float)local_1ce8 * -1.5 * (float)local_1ce8 * (float)local_1ce8;
    local_1d58 = (ulong)(uint)local_248c;
    uStack_1d50 = 0;
    local_1e68 = local_1d58;
    uStack_1e60 = 0;
    local_248c = (float)local_1ce8 * 1.5 + local_248c;
    local_1e58 = (ulong)(uint)local_248c;
    uStack_1e50 = 0;
    local_20c8 = local_1e58;
    uStack_20c0 = 0;
    local_1b78 = local_1e58;
    uStack_1b70 = 0;
    local_2470 = &local_24a8;
    local_16b8 = CONCAT44(local_248c,local_248c);
    uStack_16b0 = CONCAT44(local_248c,local_248c);
    local_16a8 = 0xbf800000bf800000;
    uStack_16a0 = 0xbf800000;
    local_1818 = local_248c * -1.0;
    fStack_1814 = local_248c * -1.0;
    fStack_1810 = local_248c * -1.0;
    fStack_180c = local_248c * 0.0;
    local_2388 = &local_2828;
    local_23b0 = &local_29f8;
    local_237c = local_2818;
    local_c48 = local_2398;
    local_bf4 = local_2818;
    local_bcc = local_2818;
    local_be8 = local_2818;
    fStack_be4 = local_2818;
    fStack_be0 = local_2818;
    fStack_bdc = local_2818;
    local_c38._0_4_ = (float)local_2828;
    local_c38._4_4_ = (float)((ulong)local_2828 >> 0x20);
    uStack_c30._0_4_ = (float)uStack_2820;
    uStack_c30._4_4_ = (float)(uStack_2820 >> 0x20);
    local_c18 = local_2818 * (float)local_c38;
    fStack_c14 = local_2818 * local_c38._4_4_;
    fStack_c10 = local_2818 * (float)uStack_c30;
    fStack_c0c = local_2818 * uStack_c30._4_4_;
    local_1b48 = CONCAT44(fStack_c14,local_c18);
    uStack_1b40 = CONCAT44(fStack_c0c,fStack_c10);
    local_23a0 = &local_29e8;
    local_23a8 = &local_2838;
    local_1b38._0_4_ = (float)local_2838;
    local_1b38._4_4_ = (float)((ulong)local_2838 >> 0x20);
    uStack_1b30._0_4_ = (float)uStack_2830;
    uStack_1b30._4_4_ = (float)(uStack_2830 >> 0x20);
    local_c68 = (float)local_1b38 + local_c18;
    fStack_c64 = local_1b38._4_4_ + fStack_c14;
    fStack_c60 = (float)uStack_1b30 + fStack_c10;
    fStack_c5c = uStack_1b30._4_4_ + fStack_c0c;
    local_1a88 = CONCAT44(fStack_c64,local_c68);
    uStack_1a80 = CONCAT44(fStack_c5c,fStack_c60);
    local_b6c = 0x80000000;
    local_b4c = 0x80000000;
    local_b50 = 0x80000000;
    local_b54 = 0x80000000;
    local_b58 = 0x80000000;
    local_bc8 = 0x8000000080000000;
    uStack_bc0 = 0x8000000080000000;
    local_ba8 = -local_1818;
    fStack_ba4 = -fStack_1814;
    fStack_ba0 = -fStack_1810;
    fStack_b9c = -fStack_180c;
    local_25e8 = &inf;
    local_2760 = local_2798;
    local_26b8 = local_2778;
    local_26b0 = local_2780;
    local_24f0 = local_2700;
    local_2488 = local_2798;
    local_2480 = local_2758;
    local_2474 = local_248c;
    local_23d0 = local_2508;
    local_23c8 = local_26c0;
    local_2378 = local_23b0;
    local_2360 = local_23a0;
    local_2358 = &local_29d8;
    local_2350 = local_2758;
    local_2348 = local_2a08;
    local_2278 = local_2798;
    local_2270 = local_2798;
    local_1f8c = local_208c;
    local_1ee8 = ZEXT416((uint)local_210c);
    local_1ecc = local_210c;
    local_1ce8 = uVar4;
    local_1ba8 = uVar5;
    local_1b38 = local_2838;
    uStack_1b30 = uStack_2830;
    local_1a70 = &local_29d8;
    local_19f0 = local_2780;
    local_1920 = local_2798;
    local_1918 = local_2798;
    local_18f8 = local_1910;
    local_18c0 = local_23b8;
    local_18b8 = local_2508;
    local_18b0 = local_26c0;
    local_1898 = local_26c0;
    local_1830 = local_2470;
    local_1828 = local_2798;
    local_1820 = local_2758;
    local_1808 = local_2758;
    local_1648 = local_2908;
    uStack_1640 = uStack_2900;
    local_d48 = local_248c;
    fStack_d44 = local_248c;
    fStack_d40 = local_248c;
    fStack_d3c = local_248c;
    local_d2c = local_248c;
    local_c58 = local_23a0;
    local_c50 = local_2388;
    local_c40 = local_23b0;
    local_c38 = local_2828;
    uStack_c30 = uStack_2820;
    local_c00 = local_23b0;
    local_bf0 = local_c48;
    local_bb8 = local_2758;
    local_bb0 = local_2a08;
    local_b90 = local_2a08;
    local_b88 = local_bc8;
    uStack_b80 = uStack_bc0;
    local_b68 = local_bc8;
    uStack_b60 = uStack_bc0;
    local_b48 = local_bc8;
    uStack_b40 = uStack_bc0;
    local_920 = local_1910;
    local_840 = local_8f8;
    local_7f0 = local_8f8;
    local_6f0 = local_7e8;
    local_6e0 = local_8f0;
    local_6b8 = local_208c;
    local_6a8 = local_8f0;
    local_6a0 = local_7e8;
    local_698 = local_6e8;
    local_690 = local_838;
    local_688 = local_8f8;
    local_680 = local_6e8;
    local_668 = local_908;
    uStack_660 = uStack_900;
    local_648 = local_6e8;
    local_640 = local_838;
    local_638 = local_8f8;
    local_328 = local_8f8;
    local_320 = local_838;
    local_318 = uStack_1904;
    uStack_314 = uStack_1904;
    uStack_310 = uStack_1904;
    uStack_30c = uStack_1904;
    local_308 = local_678;
    uStack_300 = uStack_670;
    local_2f8 = local_838;
    local_2f0 = local_8f8;
    local_298 = local_908;
    uStack_290 = uStack_900;
    local_168 = local_8f8;
    local_160 = local_7e8;
    local_158 = uStack_1900;
    uStack_154 = uStack_1900;
    uStack_150 = uStack_1900;
    uStack_14c = uStack_1900;
    local_148 = local_6d8;
    uStack_140 = uStack_6d0;
    local_138 = local_7e8;
    local_130 = local_8f8;
    local_128 = local_908;
    uStack_120 = uStack_900;
    local_74 = local_2800 * local_24fc;
    local_70 = local_2804 * local_24fc;
    local_6c = local_21f8;
    local_60 = local_24f8;
    local_58 = local_2700;
    local_50 = local_24f8;
    local_30 = local_2700;
    local_28 = local_24f8;
    local_20 = local_24f8;
    local_29f8 = local_1b48;
    uStack_29f0 = uStack_1b40;
    local_29e8 = local_1a88;
    uStack_29e0 = uStack_1a80;
    local_29d8 = local_1a88;
    uStack_29d0 = uStack_1a80;
    local_2948 = local_1ae8;
    uStack_2940 = uStack_1ae0;
    local_2924[0] = local_21f8;
    local_2918._8_8_ = uStack_2200;
    uStack_28f0 = uStack_2930;
    local_24a8 = local_16b8;
    uStack_24a0 = uStack_16b0;
    local_2288 = local_908;
    uStack_2280 = uStack_900;
    local_978 = local_6c8;
    uStack_970 = uStack_6c0;
    local_968 = local_918;
    uStack_960 = uStack_910;
    local_958 = local_6d8;
    uStack_950 = uStack_6d0;
    local_948 = local_678;
    uStack_940 = uStack_670;
    local_938 = local_908;
    uStack_930 = uStack_900;
    local_2958 = local_1818;
    fStack_2954 = fStack_1814;
    local_b38 = local_1818;
    fStack_b34 = fStack_1814;
    fStack_2950 = fStack_1810;
    fStack_294c = fStack_180c;
    fStack_b30 = fStack_1810;
    fStack_b2c = fStack_180c;
    local_2918.m128[0] = local_21f8;
    local_2208 = local_21f8;
    local_28f8 = local_1a08;
    fStack_28f4 = fStack_1a04;
    local_2938 = local_1a08;
    fStack_2934 = fStack_1a04;
    local_29a8 = std::numeric_limits<float>::infinity();
    local_2580 = &local_29c8;
    local_2594 = 0x3a83126f;
    local_259c = 0;
    local_25a0 = 0xffffffff;
    local_25a4 = 0xffffffff;
    local_25a8 = 0xffffffff;
    local_14cc = 0x3a83126f;
    local_1388 = &local_14e8;
    local_138c = 0xffffffff;
    local_1390 = 0xffffffff;
    local_1394 = 0xffffffff;
    local_1398 = 0;
    local_106c = 0;
    local_1070 = 0xffffffff;
    local_1074 = 0xffffffff;
    local_1078 = 0xffffffff;
    local_1088 = 0xffffffffffffffff;
    uStack_1080 = 0xffffffff;
    local_14e8 = 0xffffffffffffffff;
    uStack_14e0 = 0xffffffff;
    local_12c8 = 0xffffffffffffffff;
    uStack_12c0 = 0xffffffff;
    local_1318 = &local_1508;
    local_1508 = 0xffffffffffffffff;
    uStack_1500 = 0xffffffff;
    local_11e8 = local_29d8;
    uStack_1140 = uStack_29d0;
    local_1320 = &local_1518;
    local_1328 = &local_1528;
    local_10e4 = 0x3a83126f;
    local_dec = 0x3a83126f;
    local_e08 = 0x3a83126f;
    uStack_e04 = 0x3a83126f;
    uStack_e00 = 0x3a83126f;
    uStack_dfc = 0x3a83126f;
    local_e88 = 0x3a83126f3a83126f;
    uStack_e80 = 0x3a83126f3a83126f;
    local_1310 = &local_14f8;
    local_f78 = 0xffffffffffffffff;
    uStack_f70 = 0xffffffff;
    uStack_ff0 = uStack_29d0 & 0xffffffff;
    local_e78 = 0xffffffffffffffff;
    uStack_e70 = 0xffffffff;
    local_1008 = 0;
    uStack_1000 = 0x3a83126f00000000;
    uStack_11e0 = uStack_ff0 | 0x3a83126f00000000;
    local_1530 = local_29b8;
    local_153c = 0;
    local_1370 = &local_1558;
    local_1374 = 0xffffffff;
    local_1378 = 0xffffffff;
    local_137c = 0xffffffff;
    local_1380 = 0;
    local_108c = 0;
    local_1090 = 0xffffffff;
    local_1094 = 0xffffffff;
    local_1098 = 0xffffffff;
    local_10a8 = 0xffffffffffffffff;
    uStack_10a0 = 0xffffffff;
    local_1558 = 0xffffffffffffffff;
    uStack_1550 = 0xffffffff;
    local_12b8 = 0xffffffffffffffff;
    uStack_12b0 = 0xffffffff;
    local_12f8 = &local_1578;
    local_1578 = 0xffffffffffffffff;
    uStack_1570 = 0xffffffff;
    local_1300 = local_1588;
    local_1308 = &local_1598;
    local_10d4 = 0;
    local_e0c = 0;
    local_e28 = 0;
    uStack_e24 = 0;
    uStack_e20 = 0;
    uStack_e1c = 0;
    local_ea8 = 0;
    uStack_ea0 = 0;
    local_12f0 = local_1568;
    local_f98 = 0xffffffffffffffff;
    uStack_f90 = 0xffffffff;
    uStack_1200 = uStack_2a00 & 0xffffffff;
    local_e98 = 0xffffffffffffffff;
    uStack_e90 = 0xffffffff;
    local_1028 = 0;
    uStack_1024 = 0;
    uStack_1020 = 0;
    uStack_101c = 0;
    local_11f0 = local_1568;
    local_10b0 = local_1568;
    local_29a4 = 0xffffffff;
    local_13d8 = auStack_2998;
    local_2984 = 0xffffffff;
    local_2980 = 0xffffffff;
    local_297c = 0xffffffff;
    local_2978 = 0xffffffff;
    local_2340 = &local_2a28;
    local_2a28 = 0;
    local_2a20 = 0;
    local_2a18 = 0;
    local_2a10 = 0;
    local_2a24 = 0x700002;
    local_2338 = &local_29c8;
    local_2598 = local_29a8;
    local_2590 = local_2a08;
    local_2588 = &local_29d8;
    local_1538 = local_2a08;
    local_14c8 = &local_29d8;
    local_14c0 = local_2580;
    local_1298 = local_1388;
    local_1290 = local_1370;
    local_1248 = local_12c8;
    uStack_1240 = uStack_12c0;
    local_1230 = local_1318;
    local_1228 = local_12b8;
    uStack_1220 = uStack_12b0;
    local_1210 = local_12f8;
    local_11d0 = local_1310;
    local_1148 = local_11e8;
    local_1130 = local_1320;
    local_1110 = local_1300;
    local_10e0 = local_1328;
    local_10d0 = local_1308;
    local_10b8 = local_1310;
    uStack_1010 = uStack_1200;
    local_ff8 = local_11e8;
    local_f88 = local_11e8;
    uStack_f80 = uStack_1140;
    local_f28 = local_12f8;
    local_f20 = local_12f8;
    local_f18 = local_1318;
    local_f10 = local_1318;
    local_ee8 = local_1308;
    local_ee0 = local_1300;
    local_ed8 = local_1328;
    local_ed0 = local_1320;
    local_29c8 = local_11e8;
    uStack_29c0 = uStack_11e0;
    uStack_29b0 = uStack_1200;
    local_1598 = local_ea8;
    uStack_1590 = uStack_ea0;
    uStack_1560 = uStack_1200;
    local_1528 = local_e88;
    uStack_1520 = uStack_e80;
    local_1518 = local_11e8;
    uStack_1510 = uStack_1140;
    local_14f8 = local_11e8;
    uStack_14f0 = uStack_11e0;
    rtcTraversableOccluded1(*(undefined8 *)(local_27b0 + 8),local_2338,&local_2a28);
    local_2330 = in_stack_00000010;
    *in_stack_00000010 = *in_stack_00000010 + 1;
    if (0.0 <= local_29a8) {
      local_2370 = &local_2828;
      local_2368 = &local_2a58;
      local_1a68 = local_2828;
      uStack_1a60 = uStack_2820;
      local_2a58._0_8_ = local_2828;
      local_2a58._8_8_ = uStack_2820;
      local_1a50 = local_2368;
      reflect(local_2a48,(Vec3fa *)&local_2368->field_1,(Vec3fa *)&local_2918.field_1);
      local_2768 = &local_2a38;
      local_1940 = &local_2268;
      local_15e8 = (float)local_2a48._0_8_;
      fStack_15e4 = SUB84(local_2a48._0_8_,4);
      fStack_15e0 = (float)local_2a48._8_8_;
      fStack_15dc = SUB84(local_2a48._8_8_,4);
      local_1938 = local_15e8 * local_15e8;
      fStack_1934 = fStack_15e4 * fStack_15e4;
      fStack_1930 = fStack_15e0 * fStack_15e0;
      fStack_192c = fStack_15dc * fStack_15dc;
      local_998 = CONCAT44(fStack_1934,local_1938);
      uStack_990 = CONCAT44(fStack_192c,fStack_1930);
      local_988 = &local_9c8;
      local_828 = &local_9d8;
      local_5b8 = CONCAT44(fStack_1934,fStack_1934);
      uStack_5b0 = CONCAT44(fStack_1934,fStack_1934);
      local_7d8 = &local_9e8;
      local_618 = CONCAT44(fStack_1930,fStack_1930);
      uStack_610 = CONCAT44(fStack_1930,fStack_1930);
      local_628 = &local_a08;
      local_598 = local_1938 + fStack_1934;
      fStack_594 = fStack_1934 + fStack_1934;
      fStack_590 = fStack_1930 + fStack_1934;
      fStack_58c = fStack_192c + fStack_1934;
      local_608 = CONCAT44(fStack_594,local_598);
      uStack_600 = CONCAT44(fStack_58c,fStack_590);
      local_980 = &local_9f8;
      local_204c = local_598 + fStack_1930;
      fStack_5f4 = fStack_594 + fStack_1930;
      fStack_5f0 = fStack_590 + fStack_1930;
      fStack_5ec = fStack_58c + fStack_1930;
      local_9a8 = CONCAT44(fStack_5f4,local_204c);
      uStack_9a0 = CONCAT44(fStack_5ec,fStack_5f0);
      local_2008 = ZEXT416((uint)local_204c);
      local_2068 = CONCAT44(0,local_204c);
      uStack_2060 = 0;
      uStack_1ec0 = 0;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_2068;
      local_2078 = rsqrtss(auVar1,auVar1);
      local_200c = 0x3fc00000;
      local_2028 = ZEXT416(0x3fc00000);
      local_1d88 = local_2078._0_8_;
      uVar4 = local_1d88;
      uStack_1d80 = local_2078._8_8_;
      local_1d88._0_4_ = local_2078._0_4_;
      local_1d78 = (ulong)(uint)((float)local_1d88 * 1.5);
      uStack_1d70 = 0;
      local_202c = 0xbf000000;
      local_2048 = ZEXT416(0xbf000000);
      local_1da8 = local_2048._0_8_;
      uStack_1da0 = 0;
      local_1d98 = (ulong)(uint)(local_204c * -0.5);
      uStack_1d90 = 0;
      local_1dc8 = local_2078._0_8_;
      uStack_1dc0 = local_2078._8_8_;
      local_244c = local_204c * -0.5 * (float)local_1d88;
      local_1db8 = (ulong)(uint)local_244c;
      uStack_1db0 = 0;
      local_1de8 = local_2078._0_8_;
      uStack_1de0 = local_2078._8_8_;
      local_1dd8 = CONCAT44(local_2078._4_4_,(float)local_1d88 * (float)local_1d88);
      uStack_1dd0 = local_2078._8_8_;
      local_1e08 = local_1dd8;
      uStack_1e00 = local_2078._8_8_;
      local_244c = local_244c * (float)local_1d88 * (float)local_1d88;
      local_1df8 = (ulong)(uint)local_244c;
      uStack_1df0 = 0;
      local_1e88 = local_1df8;
      uStack_1e80 = 0;
      local_244c = (float)local_1d88 * 1.5 + local_244c;
      local_1e78 = (ulong)(uint)local_244c;
      uStack_1e70 = 0;
      local_2088 = local_1e78;
      uStack_2080 = 0;
      local_1b88 = local_1e78;
      uStack_1b80 = 0;
      local_2430 = &local_2468;
      local_1698 = CONCAT44(local_244c,local_244c);
      uStack_1690 = CONCAT44(local_244c,local_244c);
      local_1848 = local_15e8 * local_244c;
      fStack_1844 = fStack_15e4 * local_244c;
      fStack_1840 = fStack_15e0 * local_244c;
      fStack_183c = fStack_15dc * local_244c;
      local_15a8 = CONCAT44(fStack_1844,local_1848);
      uStack_15a0 = CONCAT44(fStack_183c,fStack_1840);
      local_2218 = &local_2958;
      local_19a0 = &local_2228;
      local_15b8 = local_2958;
      fStack_15b4 = fStack_2954;
      fStack_15b0 = fStack_2950;
      fStack_15ac = fStack_294c;
      local_1998 = local_1848 * local_2958;
      fStack_1994 = fStack_1844 * fStack_2954;
      fStack_1990 = fStack_1840 * fStack_2950;
      fStack_198c = fStack_183c * fStack_294c;
      local_ab8 = CONCAT44(fStack_1994,local_1998);
      uStack_ab0 = CONCAT44(fStack_198c,fStack_1990);
      local_aa8 = &local_ae8;
      local_808 = &local_af8;
      local_438 = CONCAT44(fStack_1994,fStack_1994);
      uStack_430 = CONCAT44(fStack_1994,fStack_1994);
      local_7b8 = &local_b08;
      local_498 = CONCAT44(fStack_1990,fStack_1990);
      uStack_490 = CONCAT44(fStack_1990,fStack_1990);
      local_4a8 = &local_b28;
      local_418 = local_1998 + fStack_1994;
      fStack_414 = fStack_1994 + fStack_1994;
      fStack_410 = fStack_1990 + fStack_1994;
      fStack_40c = fStack_198c + fStack_1994;
      local_488 = CONCAT44(fStack_414,local_418);
      uStack_480 = CONCAT44(fStack_40c,fStack_410);
      local_aa0 = &local_b18;
      local_2a60[0] = local_418 + fStack_1990;
      fStack_474 = fStack_414 + fStack_1990;
      fStack_470 = fStack_410 + fStack_1990;
      fStack_46c = fStack_40c + fStack_1990;
      local_ac8 = CONCAT44(fStack_474,local_2a60[0]);
      uStack_ac0 = CONCAT44(fStack_46c,fStack_470);
      local_2a64 = 0;
      local_2a68 = 0x3f800000;
      local_22b0 = local_2a60;
      local_22b8 = &local_2a64;
      local_22c0 = &local_2a68;
      local_9c = 1.0;
      local_2b3c = local_9c;
      if (local_2a60[0] < 1.0) {
        local_2b3c = local_2a60[0];
      }
      local_c4 = 0.0;
      local_c0 = local_2b3c;
      local_2b40 = local_c4;
      if (0.0 <= local_2b3c) {
        local_2b40 = local_2b3c;
      }
      local_2324 = local_2b40;
      local_2328 = 0x41200000;
      local_2770 = local_2a48;
      local_2448 = local_2a48;
      local_2440 = local_2768;
      local_2434 = local_244c;
      local_2258 = local_2a48;
      local_2250 = local_2a48;
      local_2210 = local_2768;
      local_1fec = local_204c;
      local_1ec8 = local_2068;
      local_1d88 = uVar4;
      local_19b0 = local_2218;
      local_19a8 = local_2768;
      local_1988 = local_19a0;
      local_1950 = local_2a48;
      local_1948 = local_2a48;
      local_1928 = local_1940;
      local_1860 = local_2430;
      local_1858 = local_2a48;
      local_1850 = local_2768;
      local_1838 = local_2768;
      local_d68 = local_244c;
      fStack_d64 = local_244c;
      fStack_d60 = local_244c;
      fStack_d5c = local_244c;
      local_d4c = local_244c;
      local_ad0 = local_19a0;
      local_9b0 = local_1940;
      local_830 = local_988;
      local_810 = local_aa8;
      local_7e0 = local_988;
      local_7c0 = local_aa8;
      local_630 = local_7d8;
      local_620 = local_980;
      local_5f8 = local_204c;
      local_5e8 = local_980;
      local_5e0 = local_7d8;
      local_5d8 = local_628;
      local_5d0 = local_828;
      local_5c8 = local_988;
      local_5c0 = local_628;
      local_5a8 = local_998;
      uStack_5a0 = uStack_990;
      local_588 = local_628;
      local_580 = local_828;
      local_578 = local_988;
      local_4b0 = local_7b8;
      local_4a0 = local_aa0;
      local_478 = local_2a60[0];
      local_468 = local_aa0;
      local_460 = local_7b8;
      local_458 = local_4a8;
      local_450 = local_808;
      local_448 = local_aa8;
      local_440 = local_4a8;
      local_428 = local_ab8;
      uStack_420 = uStack_ab0;
      local_400 = local_4a8;
      local_3f8 = local_808;
      local_3f0 = local_aa8;
      local_3e8 = local_aa8;
      local_3e0 = local_808;
      local_3d8 = fStack_1994;
      fStack_3d4 = fStack_1994;
      fStack_3d0 = fStack_1994;
      fStack_3cc = fStack_1994;
      local_3c8 = local_438;
      uStack_3c0 = uStack_430;
      local_3b8 = local_808;
      local_3b0 = local_aa8;
      local_368 = local_988;
      local_360 = local_828;
      local_358 = fStack_1934;
      fStack_354 = fStack_1934;
      fStack_350 = fStack_1934;
      fStack_34c = fStack_1934;
      local_348 = local_5b8;
      uStack_340 = uStack_5b0;
      local_338 = local_828;
      local_330 = local_988;
      local_288 = local_998;
      uStack_280 = uStack_990;
      local_268 = local_ab8;
      uStack_260 = uStack_ab0;
      local_258 = local_aa8;
      local_250 = local_7b8;
      local_248 = fStack_1990;
      fStack_244 = fStack_1990;
      fStack_240 = fStack_1990;
      fStack_23c = fStack_1990;
      local_238 = local_498;
      uStack_230 = uStack_490;
      local_228 = local_7b8;
      local_220 = local_aa8;
      local_218 = local_ab8;
      uStack_210 = uStack_ab0;
      local_1b8 = local_988;
      local_1b0 = local_7d8;
      local_1a8 = fStack_1930;
      fStack_1a4 = fStack_1930;
      fStack_1a0 = fStack_1930;
      fStack_19c = fStack_1930;
      local_198 = local_618;
      uStack_190 = uStack_610;
      local_188 = local_7d8;
      local_180 = local_988;
      local_178 = local_998;
      uStack_170 = uStack_990;
      local_98 = local_2a60[0];
      local_2a38 = local_15a8;
      uStack_2a30 = uStack_15a0;
      local_2468 = local_1698;
      uStack_2460 = uStack_1690;
      local_2268 = local_998;
      uStack_2260 = uStack_990;
      local_2228 = local_ab8;
      uStack_2220 = uStack_ab0;
      local_b28 = local_488;
      uStack_b20 = uStack_480;
      local_b18 = local_ac8;
      uStack_b10 = uStack_ac0;
      local_b08 = local_498;
      uStack_b00 = uStack_490;
      local_af8 = local_438;
      uStack_af0 = uStack_430;
      local_ae8 = local_ab8;
      uStack_ae0 = uStack_ab0;
      local_a08 = local_608;
      uStack_a00 = uStack_600;
      local_9f8 = local_9a8;
      uStack_9f0 = uStack_9a0;
      local_9e8 = local_618;
      uStack_9e0 = uStack_610;
      local_9d8 = local_5b8;
      uStack_9d0 = uStack_5b0;
      local_9c8 = local_998;
      uStack_9c0 = uStack_990;
      powf(local_2b40,10.0);
      fStack_15d0 = (float)local_2918._8_8_;
      fVar6 = -(local_2958 * local_2918.m128[0] + fStack_2954 * local_2918.m128[1] +
               fStack_2950 * fStack_15d0);
      local_2b44 = 1.0;
      if (fVar6 < 1.0) {
        local_2b44 = fVar6;
      }
      local_2b48 = 0.0;
      if (0.0 <= local_2b44) {
        local_2b48 = local_2b44;
      }
      local_1668 = (float)local_2908;
      fStack_1664 = (float)((ulong)local_2908 >> 0x20);
      fStack_1660 = (float)uStack_2900;
      fStack_1ab0 = (float)uStack_28f0;
      local_1738 = (float)local_2ac8;
      fStack_1734 = (float)((ulong)local_2ac8 >> 0x20);
      local_28f8 = local_28f8 + local_1668 * local_2b48 + local_1738 * 0.5;
      fStack_28f4 = fStack_28f4 + fStack_1664 * local_2b48 + fStack_1734 * 0.5;
      uStack_28f0 = (ulong)(uint)(fStack_1ab0 + fStack_1660 * local_2b48 + fStack_2ac0 * 0.5);
    }
  }
  local_2b4c = 1.0;
  if (local_28f8 < 1.0) {
    local_2b4c = local_28f8;
  }
  local_2b50 = 0.0;
  if (0.0 <= local_2b4c) {
    local_2b50 = local_2b4c;
  }
  local_2b54 = 1.0;
  if (fStack_28f4 < 1.0) {
    local_2b54 = fStack_28f4;
  }
  local_2b58 = 0.0;
  if (0.0 <= local_2b54) {
    local_2b58 = local_2b54;
  }
  local_2b5c = 1.0;
  if ((float)uStack_28f0 < 1.0) {
    local_2b5c = (float)uStack_28f0;
  }
  local_2b60 = 0.0;
  if (0.0 <= local_2b5c) {
    local_2b60 = local_2b5c;
  }
  *(int *)(local_27c0 + (ulong)(uint)(local_27b8 * local_27c4 + local_27b4) * 4) =
       (int)(long)(local_2b60 * 255.0) * 0x10000 + (int)(long)(local_2b58 * 255.0) * 0x100 +
       (int)(long)(local_2b50 * 255.0);
  return;
}

Assistant:

void renderPixelStandard(const TutorialData& data,
                          int x, int y, 
                          int* pixels,
                          const unsigned int width,
                          const unsigned int height,
                          const float time,
                          const ISPCCamera& camera, RayStats& stats)
{
  /* initialize ray */
  Ray ray(Vec3fa(camera.xfm.p), Vec3fa(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz)), 0.0f, inf);

  /* intersect ray with scene */
  RTCIntersectArguments iargs;
  rtcInitIntersectArguments(&iargs);
  iargs.feature_mask = (RTCFeatureFlags)(FEATURE_MASK);
  
  rtcTraversableIntersect1(data.g_traversable,RTCRayHit_(ray),&iargs);
  RayStats_addRay(stats);

  /* shade pixels */
  Vec3fa color = Vec3fa(0.0f);
  if (ray.geomID != RTC_INVALID_GEOMETRY_ID)
  {
    /* interpolate diffuse color */
    Vec3fa diffuse = data.point_colors[ray.geomID ? ray.primID : 0];

    /* calculate smooth shading normal */
    Vec3fa Ng = normalize(ray.Ng);
    color = color + diffuse*0.5f;
    Vec3fa lightDir = normalize(Vec3fa(-1,-1,-1));

    /* initialize shadow ray */
    Ray shadow(ray.org + ray.tfar*ray.dir, neg(lightDir), 0.001f, inf, 0.0f);

    /* trace shadow ray */
    RTCOccludedArguments sargs;
    rtcInitOccludedArguments(&sargs);
    sargs.feature_mask = (RTCFeatureFlags)(FEATURE_MASK);
  
    rtcTraversableOccluded1(data.g_traversable,RTCRay_(shadow),&sargs);
    RayStats_addShadowRay(stats);

    /* add light contribution */
    if (shadow.tfar >= 0.0f) {
      Vec3fa r = normalize(reflect(ray.dir,Ng));
      float s = pow(clamp(dot(r,lightDir),0.0f,1.0f),10.0f);
      float d = clamp(-dot(lightDir,Ng),0.0f,1.0f);
      color = color + diffuse*d + 0.5f*Vec3fa(s);
    }
  }

  /* write color to framebuffer */
  unsigned int r = (unsigned int) (255.0f * clamp(color.x,0.0f,1.0f));
  unsigned int g = (unsigned int) (255.0f * clamp(color.y,0.0f,1.0f));
  unsigned int b = (unsigned int) (255.0f * clamp(color.z,0.0f,1.0f));
  pixels[y*width+x] = (b << 16) + (g << 8) + r;
}